

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O2

void h265e_dpb_proc_cpb(H265eDpb *dpb,EncCpbStatus *cpb)

{
  long lVar1;
  H265eDpbFrm *pHVar2;
  H265eSlice *slice;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  NALUnitType NVar6;
  int iVar7;
  RK_U32 RVar8;
  RK_U32 RVar9;
  ulong uVar10;
  int iVar11;
  RK_U32 *pRVar12;
  char *cpb_00;
  H265eDpb *dpb_00;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  EncFrmStatus *pEVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  
  if (cpb != (EncCpbStatus *)0x0 && dpb != (H265eDpb *)0x0) {
    if (((ulong)cpb->curr & 0x20) == 0) {
      uVar14 = 0;
      bVar5 = false;
LAB_001c21d1:
      if (uVar14 != 8) {
        uVar10 = cpb->init[uVar14].val;
        if ((uVar10 & 1) != 0) {
          if ((uVar10 & 0x40) != 0) {
            _mpp_log_l(2,"h265e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,"!frm->is_non_ref"
                       ,"h265e_dpb_proc_cpb",0x30c);
            if ((mpp_debug._3_1_ & 0x10) != 0) {
              abort();
            }
            uVar10 = cpb->init[uVar14].val;
          }
          uVar15 = uVar10 >> 0x30;
          if (((byte)h265e_debug & 0x80) != 0) {
            _mpp_log_l(4,"h265e_dpb","idx %d frm %d valid %d is_non_ref %d lt_ref %d\n",(char *)0x0,
                       uVar14 & 0xffffffff,uVar15,(uint)uVar10 & 1,(uint)(uVar10 >> 6) & 1,
                       (uint)uVar10 >> 7 & 1);
            uVar15 = cpb->init[uVar14].val >> 0x30;
            if (((byte)h265e_debug & 0x80) != 0) {
              _mpp_log_l(4,"h265e_dpb","frm %d start finding slot \n",(char *)0x0,uVar15);
            }
          }
          lVar13 = 0;
          pEVar16 = &dpb->frame_list[0].status;
          do {
            if (lVar13 == 0x10) {
              cpb_00 = "h265e_dpb";
              dpb_00 = (H265eDpb *)0x2;
              _mpp_log_l(2,"h265e_dpb","can not find match frm %d\n","h265e_find_cpb_in_dpb",uVar15)
              ;
              slice = dpb_00->curr->slice;
              iVar11 = slice->poc;
              if (((byte)h265e_debug & 1) != 0) {
                _mpp_log_l(4,"h265e_dpb","enter\n","h265e_dpb_build_list");
              }
              NVar6 = get_nal_unit_type(dpb_00,iVar11);
              if (NVar6 == NAL_IDR_W_RADL) {
                dpb_00->last_idr = iVar11;
                iVar7 = iVar11;
              }
              else {
                get_nal_unit_type(dpb_00,iVar11);
                iVar7 = dpb_00->last_idr;
              }
              slice->last_idr = iVar7;
              slice->m_temporalLayerNonReferenceFlag = (uint)(slice->is_referenced == 0);
              NVar6 = get_nal_unit_type(dpb_00,iVar11);
              slice->m_nalUnitType = NVar6;
              if (slice->m_temporalLayerNonReferenceFlag != 0) {
                if (NVar6 == NAL_TRAIL_R) {
                  NVar6 = NAL_TRAIL_N;
                }
                else if (NVar6 == NAL_RASL_R) {
                  NVar6 = NAL_RASL_N;
                }
                else {
                  if (NVar6 != NAL_RADL_R) goto LAB_001c2594;
                  NVar6 = NAL_RADL_N;
                }
                slice->m_nalUnitType = NVar6;
              }
LAB_001c2594:
              h265e_dpb_dec_refresh_marking(dpb_00,iVar11,NVar6);
              h265e_dpb_cpb2rps(dpb_00,iVar11,slice,(EncCpbStatus *)cpb_00);
              iVar11 = slice->m_rps->m_numberOfPictures;
              if (dpb_00->max_ref_l0 < iVar11) {
                iVar11 = dpb_00->max_ref_l0;
              }
              slice->m_numRefIdx[0] = iVar11;
              iVar11 = slice->m_rps->m_numberOfPictures;
              if (dpb_00->max_ref_l1 < iVar11) {
                iVar11 = dpb_00->max_ref_l1;
              }
              slice->m_numRefIdx[1] = iVar11;
              h265e_slice_set_ref_list(dpb_00->frame_list,slice);
              RVar8 = 1;
              RVar9 = 1;
              if (slice->m_sliceType == B_SLICE) {
                iVar11 = slice->m_numRefIdx[1];
                if ((long)iVar11 == 0) {
                  slice->m_sliceType = P_SLICE;
                }
                else {
                  slice->m_colFromL0Flag = 0;
                  for (lVar13 = 0; (RVar8 != 0 && (lVar13 < slice->m_numRefIdx[0]));
                      lVar13 = lVar13 + 1) {
                    RVar8 = (RK_U32)(slice->m_refPicList[0][lVar13]->poc <= slice->poc);
                  }
                  RVar9 = RVar8;
                  for (lVar13 = 0; (RVar9 != 0 && (lVar13 < iVar11)); lVar13 = lVar13 + 1) {
                    RVar9 = (RK_U32)(slice->m_refPicList[1][lVar13]->poc <= slice->poc);
                  }
                }
              }
              slice->m_bCheckLDC = RVar9;
              h265e_slice_set_ref_poc_list(slice);
              slice->m_bLMvdL1Zero = 0;
              slice->m_nextSlice = 0;
              RVar8 = 0;
              if (slice->m_sliceType != I_SLICE) {
                RVar8 = (slice->m_localRPS).m_numberOfPictures;
              }
              slice->tot_poc_num = RVar8;
              h265e_dpb_free_unsed(dpb_00,(EncCpbStatus *)cpb_00);
              if (((byte)h265e_debug & 1) != 0) {
                _mpp_log_l(4,"h265e_dpb","leave\n","h265e_dpb_build_list");
                return;
              }
              return;
            }
            if (((*(int *)((long)pEVar16 + 0xc) != 0) && ((pEVar16->val & 1) != 0)) &&
               ((uint)(ushort)(pEVar16->val >> 0x30) == (uint)uVar15)) goto LAB_001c22e9;
            lVar13 = lVar13 + 1;
            pEVar16 = pEVar16 + 0xc;
          } while( true );
        }
        goto LAB_001c2351;
      }
      if (bVar5) {
        if (((byte)h265e_debug & 0x80) != 0) {
          _mpp_log_l(4,"h265e_dpb","cpb roll back found",(char *)0x0);
        }
        uVar17 = 0;
        uVar18 = 0;
        for (lVar13 = 0x3c0; lVar13 != 0xa20; lVar13 = lVar13 + 0x60) {
          if (*(char *)((long)(dpb->RpsList).poc + lVar13 + -0x44) != '\0') {
            lVar1 = *(long *)((long)(dpb->RpsList).poc + lVar13 + -0x2c);
            uVar3 = *(uint *)(lVar1 + 0x10);
            uVar4 = *(uint *)(lVar1 + 0x14);
            uVar19 = -(uint)((int)uVar3 < (int)uVar17);
            uVar20 = -(uint)((int)uVar4 < (int)uVar18);
            uVar17 = uVar17 & uVar19 | ~uVar19 & uVar3;
            uVar18 = uVar18 & uVar20 | ~uVar20 & uVar4;
          }
        }
        pHVar2 = dpb->curr;
        if (pHVar2->inited != 0) {
          pHVar2->slice->is_referenced = 0;
          pHVar2->is_long_term = 0;
          pHVar2->used_by_cur = 0;
          *(undefined1 *)&pHVar2->field_7 = 0;
          (pHVar2->status).val = 0;
        }
        dpb->seq_idx = uVar17;
        dpb->gop_idx = uVar18;
      }
      pRVar12 = &dpb->frame_list[0].inited;
      for (uVar14 = 0; uVar14 != 0x11; uVar14 = uVar14 + 1) {
        if ((*pRVar12 != 0) && (*(char *)(pRVar12 + -1) == '\0')) {
          if (((byte)h265e_debug & 0x80) != 0) {
            _mpp_log_l(4,"h265e_dpb","reset index %d frame->inited %d rame->on_used %x",(char *)0x0,
                       uVar14 & 0xffffffff,(ulong)*pRVar12,
                       ((anon_union_4_2_f1ea2294_for_H265eDpbFrm_t_7 *)(pRVar12 + -1))->on_used);
          }
          ((EncFrmStatus *)(pRVar12 + -3))->val = 0;
        }
        pRVar12 = pRVar12 + 0x18;
      }
    }
    else {
      for (lVar13 = 0; lVar13 != 0x660; lVar13 = lVar13 + 0x60) {
        if (*(int *)((long)&dpb->frame_list[0].inited + lVar13) != 0) {
          *(undefined4 *)(*(long *)((long)&dpb->frame_list[0].slice + lVar13) + 0x678) = 0;
          *(undefined8 *)((long)&dpb->frame_list[0].is_long_term + lVar13) = 0;
          *(undefined1 *)((long)&dpb->frame_list[0].field_7 + lVar13) = 0;
          *(undefined8 *)((long)&dpb->frame_list[0].status + lVar13) = 0;
        }
      }
    }
  }
  return;
LAB_001c22e9:
  if (((byte)h265e_debug & 0x80) != 0) {
    _mpp_log_l(4,"h265e_dpb","frm %d match slot %d valid %d\n",(char *)0x0,uVar15,lVar13,1);
  }
  if ((char)*(ushort *)(pEVar16 + 1) == '\0') {
    *(ushort *)(pEVar16 + 1) = *(ushort *)(pEVar16 + 1) | 1;
    *pEVar16 = cpb->init[uVar14];
    *(undefined4 *)(pEVar16[4].val + 0x678) = 1;
    bVar5 = true;
  }
LAB_001c2351:
  uVar14 = uVar14 + 1;
  goto LAB_001c21d1;
}

Assistant:

void h265e_dpb_proc_cpb(H265eDpb *dpb, EncCpbStatus *cpb)
{
    EncFrmStatus *curr = &cpb->curr;
    RK_U32 index = 0, i = 0;
    H265eDpbFrm *p = NULL;
    RK_U32 need_rebuild = 0;
    RK_S32 max_gop_id = 0, max_poc = 0;

    if (!dpb || !cpb)
        return;

    if (curr->is_idr) {
        for (index = 0; index < MPP_ARRAY_ELEMS(dpb->frame_list); index++) {
            H265eDpbFrm *frame = &dpb->frame_list[index];
            if (frame->inited) {
                frame->slice->is_referenced = 0;
                frame->is_long_term = 0;
                frame->used_by_cur = 0;
                frame->dpb_used = 0;
                frame->status.val = 0;
            }
        }
        return;
    }

    for (i = 0; i < MAX_CPB_REFS; i++) {
        EncFrmStatus *frm = &cpb->init[i];

        if (!frm->valid)
            continue;

        mpp_assert(!frm->is_non_ref);

        h265e_dbg_dpb("idx %d frm %d valid %d is_non_ref %d lt_ref %d\n",
                      i, frm->seq_idx, frm->valid, frm->is_non_ref, frm->is_lt_ref);

        p = h265e_find_cpb_in_dpb(dpb->frame_list, MAX_REFS, frm);
        if (!p->dpb_used) {
            p->dpb_used = 1;
            p->status.val = frm->val;
            p->slice->is_referenced = 1;
            need_rebuild = 1;
        }
    }

    if (need_rebuild) {
        h265e_dbg_dpb("cpb roll back found");
        for (index = 0; index < MPP_ARRAY_ELEMS(dpb->frame_list); index++) {
            H265eDpbFrm *frame = &dpb->frame_list[index];

            if (frame->dpb_used) {
                if (max_poc < frame->slice->poc) {
                    max_poc = frame->slice->poc;
                }
                if (max_gop_id < frame->slice->gop_idx) {
                    max_gop_id = frame->slice->gop_idx;
                }
            }
        }

        H265eDpbFrm *frame = dpb->curr;

        if (frame->inited) {
            frame->slice->is_referenced = 0;
            frame->is_long_term = 0;
            frame->used_by_cur = 0;
            frame->dpb_used = 0;
            frame->status.val = 0;
        }
        dpb->seq_idx = max_poc;
        dpb->gop_idx = max_gop_id;
    }

    for (index = 0; index < MPP_ARRAY_ELEMS(dpb->frame_list); index++) {
        H265eDpbFrm *frame = &dpb->frame_list[index];

        if (frame->inited && !frame->dpb_used) {
            h265e_dbg_dpb("reset index %d frame->inited %d rame->on_used %x",
                          index, frame->inited, frame->on_used);
            frame->status.val = 0;
        }
    }
}